

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddGroupMoveBackward(DdManager *table,int x,int y)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int newxtop;
  int ysize;
  int ybot;
  int ytop;
  int xsize;
  int xbot;
  int xtop;
  int j;
  int i;
  int size;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  uVar1 = table->subtables[x].next;
  for (newxtop = y; (uint)newxtop < table->subtables[newxtop].next;
      newxtop = table->subtables[newxtop].next) {
  }
  xtop = 1;
  i = y;
  size = x;
  do {
    if ((newxtop - y) + 1 < xtop) {
      i = uVar1;
      for (xtop = 0; xtop < newxtop - y; xtop = xtop + 1) {
        uVar3 = cuddNextHigh(table,i);
        table->subtables[i].next = uVar3;
        i = cuddNextHigh(table,i);
      }
      table->subtables[i].next = uVar1;
      uVar3 = cuddNextHigh(table,i);
      size = uVar3;
      for (xtop = 0; xtop < (int)(x - uVar1); xtop = xtop + 1) {
        uVar4 = cuddNextHigh(table,size);
        table->subtables[size].next = uVar4;
        size = cuddNextHigh(table,size);
      }
      table->subtables[size].next = uVar3;
      return 1;
    }
    for (xbot = 1; xbot <= (int)((x - uVar1) + 1); xbot = xbot + 1) {
      iVar2 = cuddSwapInPlace(table,size,i);
      if (iVar2 == 0) {
        return 0;
      }
      i = size;
      size = cuddNextLow(table,size);
    }
    i = y + xtop;
    size = cuddNextLow(table,i);
    xtop = xtop + 1;
  } while( true );
}

Assistant:

static int
ddGroupMoveBackward(
  DdManager * table,
  int  x,
  int  y)
{
    int size;
    int i,j,xtop,xbot,xsize,ytop,ybot,ysize,newxtop;


#ifdef DD_DEBUG
    /* We assume that x < y */
    assert(x < y);
#endif

    /* Find top, bottom, and size for the two groups. */
    xbot = x;
    xtop = table->subtables[x].next;
    xsize = xbot - xtop + 1;
    ybot = y;
    while ((unsigned) ybot < table->subtables[ybot].next)
        ybot = table->subtables[ybot].next;
    ytop = y;
    ysize = ybot - ytop + 1;

    /* Sift the variables of the second group up through the first group */
    for (i = 1; i <= ysize; i++) {
        for (j = 1; j <= xsize; j++) {
            size = cuddSwapInPlace(table,x,y);
            if (size == 0)
                return(0);
            y = x;
            x = cuddNextLow(table,y);
        }
        y = ytop + i;
        x = cuddNextLow(table,y);
    }

    /* fix groups */
    y = xtop;
    for (i = 0; i < ysize - 1; i++) {
        table->subtables[y].next = cuddNextHigh(table,y);
        y = cuddNextHigh(table,y);
    }
    table->subtables[y].next = xtop; /* y is bottom of its group, join */
                                    /* to its top */
    x = cuddNextHigh(table,y);
    newxtop = x;
    for (i = 0; i < xsize - 1; i++) {
        table->subtables[x].next = cuddNextHigh(table,x);
        x = cuddNextHigh(table,x);
    }
    table->subtables[x].next = newxtop; /* x is bottom of its group, join */
                                    /* to its top */
#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"ddGroupMoveBackward:\n");
#endif

    return(1);

}